

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::PolyHit
              (float3 *vert,int n,float3 *v0,float3 *v1,float3 *impact,float3 *normal)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  float3 *v;
  float3 *v_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  float3 *pfVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float3 fVar24;
  float3 fVar25;
  float3 local_c8;
  float3 local_b8;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  float3 *local_70;
  float3 *local_68;
  float3 *local_60;
  float3 local_58;
  undefined1 local_48 [16];
  undefined1 auVar19 [60];
  
  fVar22 = 0.0;
  _local_a8 = ZEXT816(0) << 0x40;
  countpolyhit = countpolyhit + 1;
  uVar6 = 0;
  pfVar7 = vert;
  local_98 = v0;
  local_70 = normal;
  local_68 = impact;
  local_60 = v1;
  while (v_00 = local_60, v = local_98, auVar15 = in_ZMM0._8_56_, (uint)(~(n >> 0x1f) & n) != uVar6)
  {
    uVar5 = uVar6 + 1;
    fVar24 = operator-(vert + ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff
                                     ) % (long)n & 0xffffffff),pfVar7);
    local_c8.z = fVar24.z;
    auVar9._0_8_ = fVar24._0_8_;
    auVar9._8_56_ = auVar15;
    local_c8._0_8_ = vmovlps_avx(auVar9._0_16_);
    fVar24 = operator-(vert + ((long)((int)uVar6 + 2) % (long)n & 0xffffffff),
                       vert + ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff
                                     ) % (long)n & 0xffffffff));
    local_b8.z = fVar24.z;
    auVar10._0_8_ = fVar24._0_8_;
    auVar10._8_56_ = auVar15;
    local_b8._0_8_ = vmovlps_avx(auVar10._0_16_);
    fVar24 = cross(&local_c8,&local_b8);
    in_ZMM0._0_8_ = fVar24._0_8_;
    in_ZMM0._8_56_ = auVar15;
    pfVar7 = pfVar7 + 1;
    local_a8._0_4_ = (float)local_a8._0_4_ + fVar24.x;
    local_a8._4_4_ = (float)local_a8._4_4_ + fVar24.y;
    fStack_a0 = fStack_a0 + auVar15._0_4_;
    fStack_9c = fStack_9c + auVar15._4_4_;
    fVar22 = fVar22 + fVar24.z;
    uVar6 = uVar5;
  }
  auVar8 = vmovshdup_avx(_local_a8);
  fVar23 = local_a8._0_4_;
  iVar4 = 0;
  fVar16 = auVar8._0_4_;
  auVar8 = ZEXT416((uint)(fVar22 * fVar22 + fVar23 * fVar23 + fVar16 * fVar16));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar20 = auVar8._0_4_;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    fVar20 = 1.0 / fVar20;
    fVar16 = fVar16 * fVar20;
    fVar23 = fVar23 * fVar20;
    fVar22 = fVar22 * fVar20;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * vert->y)),ZEXT416((uint)fVar23),
                             ZEXT416((uint)vert->x));
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * local_98->y)),ZEXT416((uint)fVar23),
                              ZEXT416((uint)local_98->x));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar22),ZEXT416((uint)vert->z));
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar22),ZEXT416((uint)local_98->z));
    fVar20 = auVar17._0_4_ - auVar8._0_4_;
    if (0.0 <= fVar20) {
      _local_a8 = ZEXT416((uint)fVar23);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * local_60->y)),_local_a8,
                                ZEXT416((uint)local_60->x));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar22),ZEXT416((uint)local_60->z));
      fVar23 = auVar17._0_4_ - auVar8._0_4_;
      if (fVar23 <= 0.0) {
        local_88 = ZEXT416((uint)fVar16);
        if (PolyHit(ConvexDecomposition::float3_const*,int,ConvexDecomposition::float3_const&,ConvexDecomposition::float3_const&,ConvexDecomposition::float3*,ConvexDecomposition::float3*)
            ::the_point == '\0') {
          iVar4 = __cxa_guard_acquire(&PolyHit(ConvexDecomposition::float3_const*,int,ConvexDecomposition::float3_const&,ConvexDecomposition::float3_const&,ConvexDecomposition::float3*,ConvexDecomposition::float3*)
                                       ::the_point);
          if (iVar4 != 0) {
            PolyHit::the_point.x = 0.0;
            PolyHit::the_point.y = 0.0;
            PolyHit::the_point.z = 0.0;
            __cxa_guard_release(&PolyHit(ConvexDecomposition::float3_const*,int,ConvexDecomposition::float3_const&,ConvexDecomposition::float3_const&,ConvexDecomposition::float3*,ConvexDecomposition::float3*)
                                 ::the_point);
          }
        }
        local_48 = vinsertps_avx(_local_a8,local_88,0x10);
        fVar20 = fVar20 / (fVar20 - fVar23);
        uVar13 = 0;
        fVar24 = operator*(v,1.0 - fVar20);
        local_98 = fVar24._0_8_;
        uVar14 = 0;
        uStack_90 = uVar13;
        fVar25 = operator*(v_00,fVar20);
        auVar8._0_4_ = fVar25.x + (float)local_98;
        auVar8._4_4_ = fVar25.y + local_98._4_4_;
        auVar8._8_4_ = (float)uVar14 + (float)uStack_90;
        auVar8._12_4_ = (float)((ulong)uVar14 >> 0x20) + uStack_90._4_4_;
        PolyHit::the_point.z = fVar25.z + fVar24.z;
        bVar3 = true;
        uVar6 = 0;
        PolyHit::the_point._0_8_ = vmovlps_avx(auVar8);
        pfVar7 = vert;
        while ((bVar3 && ((long)uVar6 < (long)n))) {
          local_c8.z = pfVar7->z;
          uVar6 = uVar6 + 1;
          local_c8.x = pfVar7->x;
          local_c8.y = pfVar7->y;
          uVar5 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) % (long)n &
                  0xffffffff;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_c8._0_8_;
          uVar1 = vert[uVar5].x;
          uVar2 = vert[uVar5].y;
          auVar17._4_4_ = uVar2;
          auVar17._0_4_ = uVar1;
          auVar17._8_8_ = 0;
          local_b8.z = vert[uVar5].z - local_c8.z;
          auVar15 = (undefined1  [56])0x0;
          auVar8 = vsubps_avx(auVar17,auVar21);
          auVar19 = ZEXT1260(auVar8._4_12_);
          local_b8._0_8_ = vmovlps_avx(auVar8);
          fVar24 = operator-(&PolyHit::the_point,&local_c8);
          local_58.z = fVar24.z;
          auVar11._0_8_ = fVar24._0_8_;
          auVar11._8_56_ = auVar15;
          local_58._0_8_ = vmovlps_avx(auVar11._0_16_);
          fVar24 = cross(&local_b8,&local_58);
          auVar18._0_4_ = fVar24.z;
          auVar18._4_60_ = auVar19;
          auVar12._0_8_ = fVar24._0_8_;
          auVar12._8_56_ = auVar15;
          auVar8 = vmovshdup_avx(auVar12._0_16_);
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * (float)local_88._0_4_)),
                                   auVar12._0_16_,ZEXT416((uint)local_a8._0_4_));
          auVar8 = vfmadd231ss_fma(auVar8,auVar18._0_16_,ZEXT416((uint)fVar22));
          bVar3 = 0.0 <= auVar8._0_4_;
          pfVar7 = pfVar7 + 1;
        }
        iVar4 = 0;
        if (bVar3) {
          if (local_70 != (float3 *)0x0) {
            uVar13 = vmovlps_avx(local_48);
            local_70->x = (float)(int)uVar13;
            local_70->y = (float)(int)((ulong)uVar13 >> 0x20);
            local_70->z = fVar22;
          }
          iVar4 = 1;
          if (local_68 != (float3 *)0x0) {
            local_68->z = PolyHit::the_point.z;
            fVar22 = PolyHit::the_point.y;
            local_68->x = PolyHit::the_point.x;
            local_68->y = fVar22;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int PolyHit(const float3 *vert, const int n, const float3 &v0, const float3 &v1, float3 *impact, float3 *normal)
{
	countpolyhit++;
	int i;
	float3 nrml(0,0,0);
	for(i=0;i<n;i++) 
		{
		int i1=(i+1)%n;
		int i2=(i+2)%n;
		nrml = nrml + cross(vert[i1]-vert[i],vert[i2]-vert[i1]);
	}

	float m = magnitude(nrml);
	if(m==0.0)
		{
				return 0;
		}
	nrml = nrml * (1.0f/m);
	float dist = -dot(nrml,vert[0]);
	float d0,d1;
	if((d0=dot(v0,nrml)+dist) <0  ||  (d1=dot(v1,nrml)+dist) >0) 
		{        
				return 0;
		}

	static float3 the_point; 
	// By using the cached plane distances d0 and d1
	// we can optimize the following:
	//     the_point = planelineintersection(nrml,dist,v0,v1);
	float a = d0/(d0-d1);
	the_point = v0*(1-a) + v1*a;


	int inside=1;
	for(int j=0;inside && j<n;j++) 
		{
			// let inside = 0 if outside
			float3 pp1,pp2,side;
			pp1 = vert[j] ;
			pp2 = vert[(j+1)%n];
			side = cross((pp2-pp1),(the_point-pp1));
			inside = (dot(nrml,side) >= 0.0);
	}
	if(inside) 
		{
		if(normal){*normal=nrml;}
		if(impact){*impact=the_point;}
	}
	return inside;
}